

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O2

Iterator * leveldb::NewErrorIterator(Status *status)

{
  EmptyIterator *this;
  
  this = (EmptyIterator *)operator_new(0x30);
  anon_unknown_4::EmptyIterator::EmptyIterator(this,status);
  return &this->super_Iterator;
}

Assistant:

Iterator* NewErrorIterator(const Status& status) {
  return new EmptyIterator(status);
}